

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O1

bool __thiscall
FreeTypeFaceWrapper::IsCharachterCodeAdobeStandard
          (FreeTypeFaceWrapper *this,FT_ULong inCharacterCode)

{
  if (((((((0x40 < inCharacterCode - 0xbf) && (9 < inCharacterCode - 0xb4)) &&
         (4 < inCharacterCode - 0xae)) &&
        (((0x7e < inCharacterCode && (0xb < inCharacterCode - 0xa1)) &&
         ((0x37 < inCharacterCode - 0x141 ||
          ((0x80000180060003U >> (inCharacterCode - 0x141 & 0x3f) & 1) == 0)))))) &&
       ((inCharacterCode != 0x131 && (1 < inCharacterCode - 0x17d)))) &&
      ((0x1d < inCharacterCode - 0x2013 ||
       ((0x20080ee3UL >> (inCharacterCode - 0x2013 & 0x3f) & 1) == 0)))) &&
     (((((inCharacterCode != 0x192 && (inCharacterCode != 0x2dd)) && (1 < inCharacterCode - 0x2039))
       && ((inCharacterCode != 0x2044 && (inCharacterCode != 0x20ac)))) &&
      (inCharacterCode != 0x2122)))) {
    return inCharacterCode - 0xfb01 < 2;
  }
  return true;
}

Assistant:

bool FreeTypeFaceWrapper::IsCharachterCodeAdobeStandard(FT_ULong inCharacterCode)
{
	// Comparing character code to unicode value of codes in Adobe Standard Latin
	if(inCharacterCode < 0x20) // ignore control charachters
		return true;

	if(betweenIncluding<FT_ULong>(inCharacterCode,0x20,0x7E))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0xA1,0xAC))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0xAE,0xB2))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0xB4,0xBD))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0xBF,0xFF))
		return true;
	if(0x131 == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x141,0x142))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x152,0x153))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x160,0x161))
		return true;
	if(0x178 == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x17D,0x17E))
		return true;
	if(0x192 == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2C6,0x1C7))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2DA,0x1DB))
		return true;
	if(0x2DD == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2D8,0x1D9))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2013,0x2014))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2018,0x201A))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x201C,0x201E))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2022,0x2021))
		return true;
	if(0x2026 == inCharacterCode)
		return true;
	if(0x2030 == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2039,0x203A))
		return true;
	if(0x2044 == inCharacterCode)
		return true;
	if(0x20AC == inCharacterCode)
		return true;
	if(0x2122 == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0xFB01,0xFB02))
		return true;
	return false;
}